

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusion.cpp
# Opt level: O0

void __thiscall
RTFusion::calculatePose(RTFusion *this,RTVector3 *accel,RTVector3 *mag,float magDeclination)

{
  RTFLOAT *this_00;
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int local_80;
  float local_7c;
  int i;
  RTFLOAT maxVal;
  int maxIndex;
  RTQuaternion local_64;
  RTQuaternion local_54;
  undefined1 local_44 [8];
  RTQuaternion q;
  RTQuaternion m;
  float magDeclination_local;
  RTVector3 *mag_local;
  RTVector3 *accel_local;
  RTFusion *this_local;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  
  RTQuaternion::RTQuaternion((RTQuaternion *)(q.m_data + 2));
  RTQuaternion::RTQuaternion((RTQuaternion *)local_44);
  if ((this->m_enableAccel & 1U) == 0) {
    RTVector3::operator=(&this->m_measuredPose,&this->m_fusionPose);
    RTVector3::setZ(&this->m_measuredPose,0.0);
  }
  else {
    RTVector3::accelToEuler(accel,&this->m_measuredPose);
  }
  if (((this->m_enableCompass & 1U) == 0) || ((this->m_compassValid & 1U) == 0)) {
    RVar1 = RTVector3::z(&this->m_fusionPose);
    RTVector3::setZ(&this->m_measuredPose,RVar1);
  }
  else {
    RTQuaternion::fromEuler((RTQuaternion *)local_44,&this->m_measuredPose);
    this_00 = q.m_data + 2;
    RTQuaternion::setScalar((RTQuaternion *)this_00,0.0);
    RVar1 = RTVector3::x(mag);
    RTQuaternion::setX((RTQuaternion *)this_00,RVar1);
    RVar1 = RTVector3::y(mag);
    RTQuaternion::setY((RTQuaternion *)this_00,RVar1);
    RVar1 = RTVector3::z(mag);
    RTQuaternion::setZ((RTQuaternion *)this_00,RVar1);
    local_64 = RTQuaternion::operator*((RTQuaternion *)local_44,(RTQuaternion *)this_00);
    _maxVal = RTQuaternion::conjugate((RTQuaternion *)local_44);
    local_54 = RTQuaternion::operator*(&local_64,(RTQuaternion *)&maxVal);
    RTQuaternion::operator=((RTQuaternion *)(q.m_data + 2),&local_54);
    RVar1 = RTQuaternion::y((RTQuaternion *)(q.m_data + 2));
    RVar2 = RTQuaternion::x((RTQuaternion *)(q.m_data + 2));
    dVar3 = std::atan2((double)(ulong)(uint)RVar1,(double)CONCAT44(extraout_XMM0_Db,RVar2));
    RTVector3::setZ(&this->m_measuredPose,-SUB84(dVar3,0) - magDeclination);
  }
  RTQuaternion::fromEuler(&this->m_measuredQPose,&this->m_measuredPose);
  i = -1;
  local_7c = -1000.0;
  for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
    auVar4._0_4_ = RTQuaternion::data(&this->m_measuredQPose,local_80);
    auVar4._4_12_ = extraout_var;
    dVar3 = std::fabs(auVar4._0_8_);
    if (local_7c < SUB84(dVar3,0)) {
      auVar5._0_4_ = RTQuaternion::data(&this->m_measuredQPose,local_80);
      auVar5._4_12_ = extraout_var_00;
      dVar3 = std::fabs(auVar5._0_8_);
      local_7c = SUB84(dVar3,0);
      i = local_80;
    }
  }
  RVar1 = RTQuaternion::data(&this->m_measuredQPose,i);
  if ((0.0 <= RVar1) || (RVar1 = RTQuaternion::data(&this->m_fusionQPose,i), RVar1 <= 0.0)) {
    RVar1 = RTQuaternion::data(&this->m_measuredQPose,i);
    if (RVar1 <= 0.0) {
      return;
    }
    RVar1 = RTQuaternion::data(&this->m_fusionQPose,i);
    if (0.0 <= RVar1) {
      return;
    }
  }
  RVar1 = RTQuaternion::scalar(&this->m_measuredQPose);
  RTQuaternion::setScalar(&this->m_measuredQPose,-RVar1);
  RVar1 = RTQuaternion::x(&this->m_measuredQPose);
  RTQuaternion::setX(&this->m_measuredQPose,-RVar1);
  RVar1 = RTQuaternion::y(&this->m_measuredQPose);
  RTQuaternion::setY(&this->m_measuredQPose,-RVar1);
  RVar1 = RTQuaternion::z(&this->m_measuredQPose);
  RTQuaternion::setZ(&this->m_measuredQPose,-RVar1);
  RTQuaternion::toEuler(&this->m_measuredQPose,&this->m_measuredPose);
  return;
}

Assistant:

void RTFusion::calculatePose(const RTVector3& accel, const RTVector3& mag, float magDeclination)
{
    RTQuaternion m;
    RTQuaternion q;

    if (m_enableAccel) {
        accel.accelToEuler(m_measuredPose);
    } else {
        m_measuredPose = m_fusionPose;
        m_measuredPose.setZ(0);
    }

    if (m_enableCompass && m_compassValid) {
        q.fromEuler(m_measuredPose);
        m.setScalar(0);
        m.setX(mag.x());
        m.setY(mag.y());
        m.setZ(mag.z());

        m = q * m * q.conjugate();
        m_measuredPose.setZ(-atan2(m.y(), m.x()) - magDeclination);
    } else {
        m_measuredPose.setZ(m_fusionPose.z());
    }

    m_measuredQPose.fromEuler(m_measuredPose);

    //  check for quaternion aliasing. If the quaternion has the wrong sign
    //  the kalman filter will be very unhappy.

    int maxIndex = -1;
    RTFLOAT maxVal = -1000;

    for (int i = 0; i < 4; i++) {
        if (fabs(m_measuredQPose.data(i)) > maxVal) {
            maxVal = fabs(m_measuredQPose.data(i));
            maxIndex = i;
        }
    }

    //  if the biggest component has a different sign in the measured and kalman poses,
    //  change the sign of the measured pose to match.

    if (((m_measuredQPose.data(maxIndex) < 0) && (m_fusionQPose.data(maxIndex) > 0)) ||
            ((m_measuredQPose.data(maxIndex) > 0) && (m_fusionQPose.data(maxIndex) < 0))) {
        m_measuredQPose.setScalar(-m_measuredQPose.scalar());
        m_measuredQPose.setX(-m_measuredQPose.x());
        m_measuredQPose.setY(-m_measuredQPose.y());
        m_measuredQPose.setZ(-m_measuredQPose.z());
        m_measuredQPose.toEuler(m_measuredPose);
    }
}